

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

int __thiscall MatchTable::match(MatchTable *this,char *txt)

{
  char cVar1;
  value_type vVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  const_reference this_00;
  const_reference pvVar7;
  ulong uVar8;
  const_iterator __first;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  const_iterator last;
  const_iterator f;
  const_iterator first;
  int state;
  int i_1;
  int j;
  int ch;
  int i;
  allocator<int> local_3d;
  value_type_conflict local_3c;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> curr_vec;
  char *txt_local;
  MatchTable *this_local;
  
  curr_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)txt;
  sVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&this->regs);
  local_3c = 1;
  std::allocator<int>::allocator(&local_3d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,sVar4,&local_3c,&local_3d);
  std::allocator<int>::~allocator(&local_3d);
  for (j = 0; *(char *)((long)curr_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + (long)j) != '\0';
      j = j + 1) {
    cVar1 = *(char *)((long)curr_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + (long)j);
    for (state = 0;
        sVar4 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_38),
        (ulong)(long)state < sVar4; state = state + 1) {
      pvVar5 = std::vector<MatchTool,_std::allocator<MatchTool>_>::operator[]
                         (&this->tools,(long)state);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_38,(long)state);
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&pvVar5->dtran,(long)*pvVar6);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(int)cVar1);
      vVar2 = *pvVar7;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_38,(long)state);
      *pvVar6 = vVar2;
    }
  }
  first._M_current._4_4_ = 0;
  do {
    uVar8 = (ulong)first._M_current._4_4_;
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_38);
    if (sVar4 <= uVar8) {
      this_local._4_4_ = -1;
LAB_001063c7:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38)
      ;
      return this_local._4_4_;
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,(long)first._M_current._4_4_);
    first._M_current._0_4_ = *pvVar6;
    if ((int)first._M_current != 0) {
      pvVar5 = std::vector<MatchTool,_std::allocator<MatchTool>_>::operator[]
                         (&this->tools,(long)first._M_current._4_4_);
      __first = std::vector<int,_std::allocator<int>_>::cbegin(&pvVar5->targets);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
      __normal_iterator(&last);
      pvVar5 = std::vector<MatchTool,_std::allocator<MatchTool>_>::operator[]
                         (&this->tools,(long)first._M_current._4_4_);
      local_78._M_current = (int *)std::vector<int,_std::allocator<int>_>::cend(&pvVar5->targets);
      last._M_current =
           (int *)std::
                  find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                            (__first._M_current,local_78,(int *)&first);
      bVar3 = __gnu_cxx::operator!=(&last,&local_78);
      if (bVar3) {
        this_local._4_4_ = first._M_current._4_4_;
        goto LAB_001063c7;
      }
    }
    first._M_current._4_4_ = first._M_current._4_4_ + 1;
  } while( true );
}

Assistant:

int MatchTable::match(const char *txt) const {
    std::vector<int> curr_vec(regs.size(), 1);
    for (int i = 0; txt[i] != '\0'; i++) {
        int ch = (int)txt[i];
        for (int j = 0; j < curr_vec.size(); j++) {
            curr_vec[j] = tools[j].dtran[curr_vec[j]][ch];
        }
    }
    for (int i = 0; i < curr_vec.size(); i++) {
        int state = curr_vec[i];
        if (state == 0) continue;
        std::vector<int>::const_iterator first = tools[i].targets.cbegin(),
                f,
                last = tools[i].targets.cend();
        if ((f = std::find(first, last, state)) != last) {
            return i;
        }
    }
    return -1;
}